

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimstate.cpp
# Opt level: O2

void __thiscall BtorSimState::update(BtorSimState *this,BtorSimState *s)

{
  if (this->type == BITVEC) {
    update(this,(s->field_1).bv_state);
    return;
  }
  if (this->type == ARRAY) {
    update(this,(s->field_1).array_state);
    return;
  }
  die("Updating invalid state!");
  return;
}

Assistant:

void
BtorSimState::update (BtorSimState &s)
{
  switch (type)
  {
    case ARRAY:
      assert (s.type == ARRAY);
      update (s.array_state);
      break;
    case BtorSimState::Type::BITVEC:
      assert (s.type == BITVEC);
      update (s.bv_state);
      break;
    default: die ("Updating invalid state!");
  }
}